

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactorCvode.cpp
# Opt level: O3

int pele::physics::reactions::ReactorCvode::cF_RHS
              (realtype t,N_Vector y_in,N_Vector ydot_in,void *user_data)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  uint uVar14;
  int n;
  int iVar15;
  realtype *prVar16;
  int i_4;
  long lVar17;
  realtype *prVar18;
  realtype *prVar19;
  realtype *prVar20;
  long lVar21;
  long lVar22;
  byte bVar23;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dc_07;
  undefined4 extraout_XMM0_Dc_08;
  undefined4 extraout_XMM0_Dc_09;
  undefined4 extraout_XMM0_Dc_10;
  undefined4 extraout_XMM0_Dc_11;
  undefined4 extraout_XMM0_Dc_12;
  undefined4 extraout_XMM0_Dc_13;
  undefined4 extraout_XMM0_Dc_14;
  undefined4 extraout_XMM0_Dc_15;
  undefined4 extraout_XMM0_Dc_16;
  undefined4 extraout_XMM0_Dd;
  uint uVar26;
  uint uVar27;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined4 extraout_XMM0_Dd_05;
  undefined4 extraout_XMM0_Dd_06;
  undefined4 extraout_XMM0_Dd_07;
  undefined4 extraout_XMM0_Dd_08;
  undefined4 extraout_XMM0_Dd_09;
  undefined4 extraout_XMM0_Dd_10;
  undefined4 extraout_XMM0_Dd_11;
  undefined4 extraout_XMM0_Dd_12;
  undefined4 extraout_XMM0_Dd_13;
  undefined4 extraout_XMM0_Dd_14;
  undefined4 extraout_XMM0_Dd_15;
  undefined4 extraout_XMM0_Dd_16;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  double dVar31;
  double dVar32;
  Real T_1;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  Real T;
  double dVar43;
  double dVar44;
  Real tT_1;
  Real hml [9];
  Real tmp [9];
  GpuArray<double,_9U> ei_pt;
  undefined4 local_548;
  undefined4 uStack_544;
  double dStack_500;
  undefined1 local_4f8 [16];
  double local_4e8;
  double dStack_4e0;
  undefined1 local_4d8 [8];
  undefined8 uStack_4d0;
  double local_4c8;
  double dStack_4c0;
  undefined1 *local_4b8;
  undefined1 local_4a8 [16];
  undefined1 local_498 [16];
  undefined1 local_488 [16];
  double local_478;
  undefined1 auStack_470 [16];
  double dStack_460;
  double local_458;
  double dStack_450;
  undefined1 *local_448;
  undefined1 local_438 [24];
  double local_420;
  undefined1 local_418 [16];
  undefined1 local_408 [16];
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  realtype *local_368;
  int local_35c;
  undefined1 local_358 [12];
  undefined4 uStack_34c;
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  realtype *local_300;
  realtype local_2f8;
  long local_2f0;
  double local_2e8;
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  double local_2b0;
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  double local_248;
  double dStack_240;
  undefined1 local_238 [16];
  double local_228;
  double dStack_220;
  double local_218;
  double local_210 [9];
  double local_1c8;
  double dStack_1c0;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  double local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [16];
  double local_98;
  undefined8 uStack_90;
  long local_80;
  long local_78;
  double local_70;
  double local_68;
  double local_60;
  undefined1 local_58 [16];
  double local_48;
  double dStack_40;
  
  bVar23 = 0;
  local_2f8 = t;
  local_368 = N_VGetArrayPointer(y_in);
  prVar16 = N_VGetArrayPointer(ydot_in);
  *(realtype *)user_data = local_2f8;
  local_78 = (long)*(int *)((long)user_data + 8);
  local_300 = prVar16;
  if (0 < local_78) {
    local_35c = *(int *)((long)user_data + 0x14);
    local_80 = *(long *)((long)user_data + 0x28);
    local_2f0 = *(long *)((long)user_data + 0x30);
    lVar22 = *(long *)((long)user_data + 0x38);
    lVar21 = 0;
    prVar18 = local_368;
    do {
      prVar19 = local_368 + lVar21 * 10;
      prVar20 = local_210;
      for (lVar17 = 9; lVar17 != 0; lVar17 = lVar17 + -1) {
        *prVar20 = *prVar19;
        prVar19 = prVar19 + (ulong)bVar23 * -2 + 1;
        prVar20 = prVar20 + (ulong)bVar23 * -2 + 1;
      }
      lVar17 = 0;
      dVar9 = 0.0;
      do {
        dVar9 = dVar9 + prVar18[lVar17];
        lVar17 = lVar17 + 1;
      } while (lVar17 != 9);
      local_60 = 1.0 / dVar9;
      lVar17 = 0;
      do {
        local_210[lVar17] = local_210[lVar17] * local_60;
        lVar17 = lVar17 + 1;
      } while (lVar17 != 9);
      dVar42 = (*(double *)(local_2f0 + lVar21 * 8) * local_2f8 + *(double *)(local_80 + lVar21 * 8)
               ) * local_60;
      dVar43 = local_368[lVar21 * 10 + 9];
      local_228 = 0.0;
      dStack_220 = 0.0;
      local_238 = ZEXT816(0);
      local_248 = 0.0;
      dStack_240 = 0.0;
      local_258 = ZEXT816(0);
      local_218 = 0.0;
      local_408._0_8_ = dVar9;
      if (local_35c == 1) {
        dVar33 = (local_210[8] * -8.990990148011893 * 0.03569643749553795 +
                 local_210[7] * -193.57402609756912 * 0.029399658963956014 +
                 local_210[6] * 6.416557417884642 * 0.030297521662727988 +
                 local_210[5] * 40.177967868388244 * 0.05879931792791203 +
                 local_210[4] * 325.7416777274101 * 0.06250390649415588 +
                 local_210[3] * 284.5180777777778 * 0.9920634920634921 +
                 local_210[2] * -333.11840718023996 * 0.055509297807382736 +
                 local_210[1] * -8.907086482400652 * 0.03125195324707794 +
                 local_210[0] * -8.917195548386884 * 0.49603174603174605 + 0.0) * 7483016356.337915;
        dVar2 = (local_210[8] * 2.909776875799999 * 0.03569643749553795 +
                local_210[7] * 2.9039314774799996 * 0.029399658963956014 +
                local_210[6] * 5.42075541105 * 0.030297521662727988 +
                local_210[5] * 3.9370238885880005 * 0.05879931792791203 +
                local_210[4] * 8.82856346684 * 0.06250390649415588 +
                local_210[3] * 7.86790675 * 0.9920634920634921 +
                local_210[2] * -2.751866206719999 * 0.055509297807382736 +
                local_210[1] * 3.170612178728 * 0.03125195324707794 +
                local_210[0] * 2.815654471198 * 0.49603174603174605 + 0.0) * 332578504726.1296;
        local_498._0_8_ = local_210[4];
        if (dVar33 <= dVar42) {
          if (dVar42 <= dVar2) {
            if ((dVar43 < 90.0) || (4000.0 < dVar43)) {
              dVar43 = (dVar42 - dVar33) * (3910.0 / (dVar2 - dVar33)) + 90.0;
            }
            iVar15 = 200;
            do {
              dVar34 = dVar43 * dVar43;
              dVar2 = dVar43 * dVar34;
              dVar33 = dVar43 * dVar2;
              dVar35 = 1.0 / dVar43;
              dVar44 = dVar33 * 0.0 + dVar2 * 0.0 + dVar34 * 0.0 + dVar43 * 0.0 + 1.5;
              if (1000.0 <= dVar43) {
                dVar8 = dVar33 * -1.3506702e-15 +
                        dVar2 * 2.52426e-11 +
                        dVar34 * -1.89492033e-07 + dVar43 * 0.0007439885 + 1.92664;
                dVar10 = dVar33 * -2.86330712e-15 +
                         dVar2 * 5.87225893e-11 +
                         dVar34 * -4.9156294e-07 + dVar43 * 0.0021680682 + 3.57316685;
                dVar11 = dVar35 * -1233.93018 +
                         dVar33 * -2.27287062e-16 +
                         dVar2 * 4.4382037e-12 +
                         dVar34 * -4.19613997e-08 + dVar43 * 0.000306759845 + 2.69757819;
                dVar36 = dVar35 * -835.033997 +
                         dVar33 * 3.16550358e-16 +
                         dVar2 * -2.30789455e-12 +
                         dVar34 * -1.8779429e-08 + dVar43 * 0.000350032206 + 1.99142337;
                dVar39 = dVar35 * 29230.8027 +
                         dVar33 * -8.736103e-17 +
                         dVar2 * 1.13776685e-12 +
                         dVar34 * -1.03426778e-09 + dVar43 * -1.37753096e-05 + 1.54205966;
                dVar31 = dVar35 * -29899.209 +
                         dVar33 * -1.27832357e-15 +
                         dVar2 * 3.00249098e-11 +
                         dVar34 * -2.9100867e-07 + dVar43 * 0.00152814644 + 1.67214561;
                dVar37 = dVar35 * 111.856713 +
                         dVar33 * -2.1581707e-15 +
                         dVar2 * 2.85615925e-11 +
                         dVar34 * -2.11219383e-07 + dVar43 * 0.00111991006 + 3.0172109;
                dVar40 = dVar35 * 3683.62875 +
                         dVar33 * -2.66391752e-16 +
                         dVar2 * 7.63046685e-12 +
                         dVar34 * -8.63609193e-08 + dVar43 * 0.00052825224 + 1.86472886;
                dVar12 = -922.7977;
                dVar32 = -18006.9609;
              }
              else {
                dVar8 = dVar33 * -4.88971e-13 +
                        dVar2 * 1.41037875e-09 +
                        dVar34 * -1.321074e-06 + dVar43 * 0.00070412 + 2.298677;
                dVar10 = dVar33 * 4.9430295e-13 +
                         dVar2 * -1.15645138e-09 +
                         dVar34 * -4.95004193e-08 + dVar43 * 0.0032846129 + 2.38875365;
                dVar11 = dVar35 * -1005.24902 +
                         dVar33 * -1.75371078e-13 +
                         dVar2 * 3.28469308e-10 +
                         dVar34 * -1.91871682e-07 + dVar43 * 0.000563743175 + 2.2129364;
                dVar36 = dVar35 * -1012.52087 +
                         dVar33 * 8.26974448e-14 +
                         dVar2 * -2.36885858e-11 +
                         dVar34 * -2.71433843e-07 + dVar43 * 0.000412472087 + 2.29812431;
                dVar39 = dVar35 * 29147.6445 +
                         dVar33 * 7.78139272e-14 +
                         dVar2 * -4.00710797e-10 +
                         dVar34 * 8.07010567e-07 + dVar43 * -0.000819083245 + 1.94642878;
                dVar31 = dVar35 * -30208.1133 +
                         dVar33 * -5.01317694e-13 +
                         dVar2 * 1.74214532e-09 +
                         dVar34 * -2.11823211e-06 + dVar43 * 0.00173749123 + 2.38684249;
                dVar37 = dVar35 * 294.80804 +
                         dVar33 * 1.85845025e-12 +
                         dVar2 * -6.06909735e-09 +
                         dVar34 * 7.05276303e-06 + dVar43 * -0.00237456025 + 3.30179801;
                dVar40 = dVar35 * 3346.30913 +
                         dVar33 * 4.12474758e-13 +
                         dVar2 * -1.44963411e-09 +
                         dVar34 * 2.1758823e-06 + dVar43 * -0.0016127247 + 3.12530561;
                dVar12 = -1020.9;
                dVar32 = -17663.1465;
              }
              if (1000.0 <= dVar43) {
                dVar6 = dVar2 * -9.23157818e-12 +
                        dVar34 * -5.63382869e-08 + dVar43 * 0.000700064411 + 1.99142337;
                dVar7 = dVar2 * 1.77528148e-11 +
                        dVar34 * -1.25884199e-07 + dVar43 * 0.000613519689 + 2.69757819;
                dVar13 = dVar33 * -1.43165356e-14 +
                         dVar2 * 2.34890357e-10 +
                         dVar34 * -1.47468882e-06 + dVar43 * 0.00433613639 + 3.57316685;
                dVar3 = dVar33 * -6.753351e-15 +
                        dVar2 * 1.009704e-10 +
                        dVar34 * -5.684761e-07 + dVar43 * 0.001487977 + 1.92664;
                dVar38 = dVar33 * -1.33195876e-15 +
                         dVar2 * 3.05218674e-11 +
                         dVar34 * -2.59082758e-07 + dVar43 * 0.00105650448 + 1.86472886;
                dVar41 = dVar33 * -1.07908535e-14 +
                         dVar2 * 1.1424637e-10 +
                         dVar34 * -6.3365815e-07 + dVar43 * 0.00223982013 + 3.0172109;
                dVar4 = dVar33 * -6.39161787e-15 +
                        dVar2 * 1.20099639e-10 +
                        dVar34 * -8.73026011e-07 + dVar43 * 0.00305629289 + 1.67214561;
                dVar5 = dVar33 * -4.3680515e-16 +
                        dVar2 * 4.55106742e-12 +
                        dVar34 * -3.10280335e-09 + dVar43 * -2.75506191e-05 + 1.54205966;
                dVar2 = 1.58275179e-15;
                dVar34 = -1.13643531e-15;
              }
              else {
                dVar6 = dVar2 * -9.47543433e-11 +
                        dVar34 * -8.14301529e-07 + dVar43 * 0.000824944174 + 2.29812431;
                dVar7 = dVar2 * 1.31387723e-09 +
                        dVar34 * -5.75615047e-07 + dVar43 * 0.00112748635 + 2.2129364;
                dVar13 = dVar33 * 2.47151475e-12 +
                         dVar2 * -4.62580552e-09 +
                         dVar34 * -1.48501258e-07 + dVar43 * 0.00656922581 + 2.38875365;
                dVar3 = dVar33 * -2.444855e-12 +
                        dVar2 * 5.641515e-09 +
                        dVar34 * -3.963222e-06 + dVar43 * 0.00140824 + 2.298677;
                dVar38 = dVar33 * 2.06237379e-12 +
                         dVar2 * -5.79853643e-09 +
                         dVar34 * 6.52764691e-06 + dVar43 * -0.00322544939 + 3.12530561;
                dVar41 = dVar33 * 9.29225124e-12 +
                         dVar2 * -2.42763894e-08 +
                         dVar34 * 2.11582891e-05 + dVar43 * -0.00474912051 + 3.30179801;
                dVar4 = dVar33 * -2.50658847e-12 +
                        dVar2 * 6.96858127e-09 +
                        dVar34 * -6.35469633e-06 + dVar43 * 0.00347498246 + 2.38684249;
                dVar5 = dVar33 * 3.89069636e-13 +
                        dVar2 * -1.60284319e-09 +
                        dVar34 * 2.4210317e-06 + dVar43 * -0.00163816649 + 1.94642878;
                dVar2 = 4.13487224e-13;
                dVar34 = -8.76855392e-13;
              }
              dVar2 = (dVar42 - dVar43 * 83144626.1815324 *
                                (local_210[8] * (dVar35 * dVar12 + dVar8) * 0.03569643749553795 +
                                (dVar35 * dVar32 + dVar10) * local_210[7] * 0.029399658963956014 +
                                local_210[6] * dVar37 * 0.030297521662727988 +
                                dVar40 * local_210[5] * 0.05879931792791203 +
                                local_210[4] * dVar39 * 0.06250390649415588 +
                                (dVar35 * 25471.627 + dVar44) * local_210[3] * 0.9920634920634921 +
                                dVar31 * local_210[2] * 0.055509297807382736 +
                                local_210[1] * dVar11 * 0.03125195324707794 +
                                dVar36 * local_210[0] * 0.49603174603174605 + 0.0)) /
                      ((dVar3 * local_210[8] * 0.03569643749553795 +
                       local_210[7] * dVar13 * 0.029399658963956014 +
                       dVar41 * local_210[6] * 0.030297521662727988 +
                       local_210[5] * dVar38 * 0.05879931792791203 +
                       dVar5 * local_210[4] * 0.06250390649415588 +
                       dVar44 * local_210[3] * 0.9920634920634921 +
                       local_210[2] * dVar4 * 0.055509297807382736 +
                       (dVar33 * dVar34 + dVar7) * local_210[1] * 0.03125195324707794 +
                       local_210[0] * (dVar33 * dVar2 + dVar6) * 0.49603174603174605 + 0.0) *
                      83144626.1815324);
              dVar33 = 100.0;
              if ((dVar2 <= 100.0) && (dVar33 = -100.0, -100.0 <= dVar2)) {
                if (ABS(dVar2) < 1e-06) break;
                dVar33 = dVar2;
                if ((dVar43 + dVar2 == dVar43) && (!NAN(dVar43 + dVar2) && !NAN(dVar43))) break;
              }
              dVar43 = dVar43 + dVar33;
              iVar15 = iVar15 + -1;
            } while (iVar15 != 0);
          }
          else {
            dVar43 = (dVar2 - dVar42) /
                     ((local_210[8] * 3.516178144 * 0.03569643749553795 +
                      local_210[7] * 8.690641024400003 * 0.029399658963956014 +
                      local_210[6] * 6.387270204000001 * 0.030297521662727988 +
                      local_210[5] * 3.55784072304 * 0.05879931792791203 +
                      local_210[4] * 1.56165852648 * 0.06250390649415588 +
                      local_210[3] * 1.5 * 0.9920634920634921 +
                      local_210[2] * 5.97902371528 * 0.055509297807382736 +
                      local_210[1] * 3.98276246984 * 0.03125195324707794 +
                      local_210[0] * 3.70463187832 * 0.49603174603174605 + 0.0) * -83144626.1815324)
                     + 4000.0;
          }
        }
        else {
          dVar43 = (dVar33 - dVar42) /
                   ((local_210[8] * 2.39726875929845 * 0.03569643749553795 +
                    local_210[7] * 2.975571056568868 * 0.029399658963956014 +
                    local_210[6] * 3.0286714825412564 * 0.030297521662727988 +
                    local_210[5] * 2.8837972841578914 * 0.05879931792791203 +
                    local_210[4] * 1.817461206843308 * 0.06250390649415588 +
                    local_210[3] * 1.5 * 0.9920634920634921 +
                    local_210[2] * 2.6530335096033126 * 0.055509297807382736 +
                    local_210[1] * 2.3106479756377003 * 0.03125195324707794 +
                    local_210[0] * 2.3657314962556013 * 0.49603174603174605 + 0.0) *
                   -83144626.1815324) + 90.0;
        }
        dVar42 = dVar43 * dVar43;
        dVar2 = dVar43 * dVar42;
        dVar44 = dVar43 * dVar2;
        local_4f8._8_8_ = 0x3fa000418a43bf8c;
        local_4f8._0_8_ = 0x3fdfbefbefbefbf0;
        local_4e8 = 0.055509297807382736;
        dStack_4e0 = 0.9920634920634921;
        uStack_4d0 = 0.05879931792791203;
        local_4d8 = (undefined1  [8])0x3fb000418a43bf8c;
        local_4c8 = 0.030297521662727988;
        dStack_4c0 = 0.029399658963956014;
        local_4b8 = &DAT_3fa246cdaf410bdd;
        dVar33 = 1.0 / dVar43;
        if (1000.0 <= dVar43) {
          local_258._0_8_ =
               dVar33 * -835.033997 +
               dVar44 * 3.16550358e-16 +
               dVar2 * -2.30789455e-12 +
               dVar42 * -1.8779429e-08 + dVar43 * 0.000350032206 + 1.99142337;
          local_258._8_8_ =
               dVar33 * -1233.93018 +
               dVar44 * -2.27287062e-16 +
               dVar2 * 4.4382037e-12 +
               dVar42 * -4.19613997e-08 + dVar43 * 0.000306759845 + 2.69757819;
          dVar37 = dVar33 * 29230.8027 +
                   dVar44 * -8.736103e-17 +
                   dVar2 * 1.13776685e-12 +
                   dVar42 * -1.03426778e-09 + dVar43 * -1.37753096e-05 + 1.54205966;
          dVar40 = dVar33 * 3683.62875 +
                   dVar44 * -2.66391752e-16 +
                   dVar2 * 7.63046685e-12 +
                   dVar42 * -8.63609193e-08 + dVar43 * 0.00052825224 + 1.86472886;
          local_228 = dVar33 * 111.856713 +
                      dVar44 * -2.1581707e-15 +
                      dVar2 * 2.85615925e-11 +
                      dVar42 * -2.11219383e-07 + dVar43 * 0.00111991006 + 3.0172109;
          dStack_220 = dVar33 * -18006.9609 +
                       dVar44 * -2.86330712e-15 +
                       dVar2 * 5.87225893e-11 +
                       dVar42 * -4.9156294e-07 + dVar43 * 0.0021680682 + 3.57316685;
          dVar12 = dVar44 * -1.27832357e-15 +
                   dVar2 * 3.00249098e-11 +
                   dVar42 * -2.9100867e-07 + dVar43 * 0.00152814644 + 1.67214561;
          dVar32 = dVar44 * -1.3506702e-15 +
                   dVar2 * 2.52426e-11 + dVar42 * -1.89492033e-07 + dVar43 * 0.0007439885 + 1.92664;
          dVar34 = -29899.209;
          dVar35 = -922.7977;
        }
        else {
          local_258._0_8_ =
               dVar33 * -1012.52087 +
               dVar44 * 8.26974448e-14 +
               dVar2 * -2.36885858e-11 +
               dVar42 * -2.71433843e-07 + dVar43 * 0.000412472087 + 2.29812431;
          local_258._8_8_ =
               dVar33 * -1005.24902 +
               dVar44 * -1.75371078e-13 +
               dVar2 * 3.28469308e-10 +
               dVar42 * -1.91871682e-07 + dVar43 * 0.000563743175 + 2.2129364;
          dVar37 = dVar33 * 29147.6445 +
                   dVar44 * 7.78139272e-14 +
                   dVar2 * -4.00710797e-10 +
                   dVar42 * 8.07010567e-07 + dVar43 * -0.000819083245 + 1.94642878;
          dVar40 = dVar33 * 3346.30913 +
                   dVar44 * 4.12474758e-13 +
                   dVar2 * -1.44963411e-09 +
                   dVar42 * 2.1758823e-06 + dVar43 * -0.0016127247 + 3.12530561;
          local_228 = dVar33 * 294.80804 +
                      dVar44 * 1.85845025e-12 +
                      dVar2 * -6.06909735e-09 +
                      dVar42 * 7.05276303e-06 + dVar43 * -0.00237456025 + 3.30179801;
          dStack_220 = dVar33 * -17663.1465 +
                       dVar44 * 4.9430295e-13 +
                       dVar2 * -1.15645138e-09 +
                       dVar42 * -4.95004193e-08 + dVar43 * 0.0032846129 + 2.38875365;
          dVar12 = dVar44 * -5.01317694e-13 +
                   dVar2 * 1.74214532e-09 +
                   dVar42 * -2.11823211e-06 + dVar43 * 0.00173749123 + 2.38684249;
          dVar32 = dVar44 * -4.88971e-13 +
                   dVar2 * 1.41037875e-09 + dVar42 * -1.321074e-06 + dVar43 * 0.00070412 + 2.298677;
          dVar34 = -30208.1133;
          dVar35 = -1020.9;
        }
        dVar39 = dVar44 * 0.0 + dVar2 * 0.0 + dVar42 * 0.0 + dVar43 * 0.0 + 1.5;
        local_248 = dVar33 * dVar34 + dVar12;
        dStack_240 = dVar33 * 25471.627 + dVar39;
        local_238._8_4_ = SUB84(dVar40,0);
        local_238._0_8_ = dVar37;
        local_238._12_4_ = (int)((ulong)dVar40 >> 0x20);
        local_218 = dVar33 * dVar35 + dVar32;
        lVar17 = 0;
        do {
          *(double *)(local_258 + lVar17 * 8) =
               *(double *)(local_4f8 + lVar17 * 8) * dVar43 * 83144626.1815324 *
               *(double *)(local_258 + lVar17 * 8);
          lVar17 = lVar17 + 1;
        } while (lVar17 != 9);
        if (1000.0 <= dVar43) {
          dVar32 = dVar2 * -9.23157818e-12 +
                   dVar42 * -5.63382869e-08 + dVar43 * 0.000700064411 + 1.99142337;
          dVar37 = dVar2 * 1.77528148e-11 +
                   dVar42 * -1.25884199e-07 + dVar43 * 0.000613519689 + 2.69757819;
          dVar33 = dVar44 * -1.43165356e-14 +
                   dVar2 * 2.34890357e-10 +
                   dVar42 * -1.47468882e-06 + dVar43 * 0.00433613639 + 3.57316685;
          dVar34 = dVar44 * -6.753351e-15 +
                   dVar2 * 1.009704e-10 + dVar42 * -5.684761e-07 + dVar43 * 0.001487977 + 1.92664;
          dVar40 = dVar44 * -1.33195876e-15 +
                   dVar2 * 3.05218674e-11 +
                   dVar42 * -2.59082758e-07 + dVar43 * 0.00105650448 + 1.86472886;
          dVar31 = dVar44 * -1.07908535e-14 +
                   dVar2 * 1.1424637e-10 +
                   dVar42 * -6.3365815e-07 + dVar43 * 0.00223982013 + 3.0172109;
          dVar35 = dVar44 * -6.39161787e-15 +
                   dVar2 * 1.20099639e-10 +
                   dVar42 * -8.73026011e-07 + dVar43 * 0.00305629289 + 1.67214561;
          dVar12 = dVar44 * -4.3680515e-16 +
                   dVar2 * 4.55106742e-12 +
                   dVar42 * -3.10280335e-09 + dVar43 * -2.75506191e-05 + 1.54205966;
          dVar42 = 1.58275179e-15;
          dVar2 = -1.13643531e-15;
        }
        else {
          dVar32 = dVar2 * -9.47543433e-11 +
                   dVar42 * -8.14301529e-07 + dVar43 * 0.000824944174 + 2.29812431;
          dVar37 = dVar2 * 1.31387723e-09 +
                   dVar42 * -5.75615047e-07 + dVar43 * 0.00112748635 + 2.2129364;
          dVar33 = dVar44 * 2.47151475e-12 +
                   dVar2 * -4.62580552e-09 +
                   dVar42 * -1.48501258e-07 + dVar43 * 0.00656922581 + 2.38875365;
          dVar34 = dVar44 * -2.444855e-12 +
                   dVar2 * 5.641515e-09 + dVar42 * -3.963222e-06 + dVar43 * 0.00140824 + 2.298677;
          dVar40 = dVar44 * 2.06237379e-12 +
                   dVar2 * -5.79853643e-09 +
                   dVar42 * 6.52764691e-06 + dVar43 * -0.00322544939 + 3.12530561;
          dVar31 = dVar44 * 9.29225124e-12 +
                   dVar2 * -2.42763894e-08 +
                   dVar42 * 2.11582891e-05 + dVar43 * -0.00474912051 + 3.30179801;
          dVar35 = dVar44 * -2.50658847e-12 +
                   dVar2 * 6.96858127e-09 +
                   dVar42 * -6.35469633e-06 + dVar43 * 0.00347498246 + 2.38684249;
          dVar12 = dVar44 * 3.89069636e-13 +
                   dVar2 * -1.60284319e-09 +
                   dVar42 * 2.4210317e-06 + dVar43 * -0.00163816649 + 1.94642878;
          dVar42 = 4.13487224e-13;
          dVar2 = -8.76855392e-13;
        }
        local_420 = (local_210[8] * dVar34 * 0.03569643749553795 +
                    local_210[7] * dVar33 * 0.029399658963956014 +
                    local_210[6] * dVar31 * 0.030297521662727988 +
                    local_210[5] * dVar40 * 0.05879931792791203 +
                    local_210[4] * dVar12 * 0.06250390649415588 +
                    local_210[3] * dVar39 * 0.9920634920634921 +
                    local_210[2] * dVar35 * 0.055509297807382736 +
                    local_210[1] * (dVar44 * dVar2 + dVar37) * 0.03125195324707794 +
                    local_210[0] * (dVar44 * dVar42 + dVar32) * 0.49603174603174605 + 0.0) *
                    83144626.1815324;
      }
      else if (local_35c == 2) {
        local_488._0_8_ = 0x3fdfbefbefbefbf0;
        local_488._8_8_ = 0x3fa000418a43bf8c;
        local_478 = 0.055509297807382736;
        auStack_470._0_8_ = 0x3fefbefbefbefbf0;
        auStack_470._8_8_ = 0x3fb000418a43bf8c;
        dStack_460 = 0.05879931792791203;
        local_458 = 0.030297521662727988;
        dStack_450 = 0.029399658963956014;
        local_448 = &DAT_3fa246cdaf410bdd;
        local_4f8._0_8_ = 0xc01fab354f516f0e;
        local_4f8._8_8_ = 0xc01fa0db476237c9;
        local_4e8 = -332.11840718023996;
        dStack_4e0 = 285.5180777777778;
        local_4d8 = (undefined1  [8])0x40746bdde976f65e;
        uStack_4d0 = 41.177967868388244;
        local_4c8 = 7.416557417884642;
        dStack_4c0 = -192.57402609756912;
        local_4b8 = (undefined1 *)0xc01ff6c61f117a25;
        lVar17 = 0;
        do {
          *(double *)(local_2e0 + lVar17 * 8 + -8) =
               local_210[lVar17] * *(double *)(local_4f8 + lVar17 * 8) *
               *(double *)(local_488 + lVar17 * 8);
          lVar17 = lVar17 + 1;
        } while (lVar17 != 9);
        dVar2 = 0.0;
        lVar17 = 0;
        do {
          dVar2 = dVar2 + *(double *)(local_2e0 + lVar17 * 8 + -8);
          lVar17 = lVar17 + 1;
        } while (lVar17 != 9);
        local_488._0_8_ = 0x3fdfbefbefbefbf0;
        local_488._8_8_ = 0x3fa000418a43bf8c;
        local_478 = 0.055509297807382736;
        auStack_470._0_8_ = 0x3fefbefbefbefbf0;
        auStack_470._8_8_ = 0x3fb000418a43bf8c;
        dStack_460 = 0.05879931792791203;
        local_458 = 0.030297521662727988;
        dStack_450 = 0.029399658963956014;
        local_448 = &DAT_3fa246cdaf410bdd;
        local_4f8._8_8_ = 0x4010aeb4f57fbe89;
        local_4f8._0_8_ = 0x400e8675d9f50d7c;
        local_4e8 = -1.751866206720001;
        dStack_4e0 = 8.86790675;
        local_4d8 = (undefined1  [8])0x4023a839788179f3;
        uStack_4d0 = 4.937023888588;
        local_4c8 = 6.420755411050001;
        dStack_4c0 = 3.9039314774799996;
        local_4b8 = (undefined1 *)0x400f47391941be92;
        lVar17 = 0;
        do {
          *(double *)(local_2e0 + lVar17 * 8 + -8) =
               local_210[lVar17] * *(double *)(local_4f8 + lVar17 * 8) *
               *(double *)(local_488 + lVar17 * 8);
          lVar17 = lVar17 + 1;
        } while (lVar17 != 9);
        dVar33 = 0.0;
        lVar17 = 0;
        do {
          dVar33 = dVar33 + *(double *)(local_2e0 + lVar17 * 8 + -8);
          lVar17 = lVar17 + 1;
        } while (lVar17 != 9);
        dVar2 = dVar2 * 7483016356.337915;
        dVar33 = dVar33 * 332578504726.1296;
        if (dVar2 <= dVar42) {
          if (dVar42 <= dVar33) {
            if ((dVar43 < 90.0) || (4000.0 < dVar43)) {
              dVar43 = (dVar42 - dVar2) * (3910.0 / (dVar33 - dVar2)) + 90.0;
            }
            iVar15 = 0;
            do {
              dVar44 = dVar43 * dVar43;
              dVar33 = dVar43 * dVar44;
              dVar2 = dVar43 * dVar33;
              local_488._0_8_ = 0x3fdfbefbefbefbf0;
              local_488._8_8_ = 0x3fa000418a43bf8c;
              local_478 = 0.055509297807382736;
              auStack_470._0_8_ = 0x3fefbefbefbefbf0;
              auStack_470._8_8_ = 0x3fb000418a43bf8c;
              dStack_460 = 0.05879931792791203;
              local_458 = 0.030297521662727988;
              dStack_450 = 0.029399658963956014;
              local_448 = &DAT_3fa246cdaf410bdd;
              dVar34 = 1.0 / dVar43;
              if (1000.0 <= dVar43) {
                dVar32 = dVar34 * -835.033997 +
                         dVar2 * 3.16550358e-16 +
                         dVar33 * -2.30789455e-12 +
                         dVar44 * -1.8779429e-08 + dVar43 * 0.000350032206 + 2.99142337;
                dVar37 = dVar34 * -1233.93018 +
                         dVar2 * -2.27287062e-16 +
                         dVar33 * 4.4382037e-12 +
                         dVar44 * -4.19613997e-08 + dVar43 * 0.000306759845 + 3.69757819;
                local_4d8 = (undefined1  [8])
                            (dVar34 * 29230.8027 +
                            dVar2 * -8.736103e-17 +
                            dVar33 * 1.13776685e-12 +
                            dVar44 * -1.03426778e-09 + dVar43 * -1.37753096e-05 + 2.54205966);
                uStack_4d0 = dVar34 * 3683.62875 +
                             dVar2 * -2.66391752e-16 +
                             dVar33 * 7.63046685e-12 +
                             dVar44 * -8.63609193e-08 + dVar43 * 0.00052825224 + 2.86472886;
                local_4c8 = dVar34 * 111.856713 +
                            dVar2 * -2.1581707e-15 +
                            dVar33 * 2.85615925e-11 +
                            dVar44 * -2.11219383e-07 + dVar43 * 0.00111991006 + 4.0172109;
                dStack_4c0 = dVar34 * -18006.9609 +
                             dVar2 * -2.86330712e-15 +
                             dVar33 * 5.87225893e-11 +
                             dVar44 * -4.9156294e-07 + dVar43 * 0.0021680682 + 4.57316685;
                dVar40 = dVar2 * -1.27832357e-15 +
                         dVar33 * 3.00249098e-11 +
                         dVar44 * -2.9100867e-07 + dVar43 * 0.00152814644 + 2.67214561;
                dVar39 = dVar2 * -1.3506702e-15 +
                         dVar33 * 2.52426e-11 +
                         dVar44 * -1.89492033e-07 + dVar43 * 0.0007439885 + 2.92664;
                dVar35 = -29899.209;
                dVar12 = -922.7977;
              }
              else {
                dVar32 = dVar34 * -1012.52087 +
                         dVar2 * 8.26974448e-14 +
                         dVar33 * -2.36885858e-11 +
                         dVar44 * -2.71433843e-07 + dVar43 * 0.000412472087 + 3.29812431;
                dVar37 = dVar34 * -1005.24902 +
                         dVar2 * -1.75371078e-13 +
                         dVar33 * 3.28469308e-10 +
                         dVar44 * -1.91871682e-07 + dVar43 * 0.000563743175 + 3.2129364;
                local_4d8 = (undefined1  [8])
                            (dVar34 * 29147.6445 +
                            dVar2 * 7.78139272e-14 +
                            dVar33 * -4.00710797e-10 +
                            dVar44 * 8.07010567e-07 + dVar43 * -0.000819083245 + 2.94642878);
                uStack_4d0 = dVar34 * 3346.30913 +
                             dVar2 * 4.12474758e-13 +
                             dVar33 * -1.44963411e-09 +
                             dVar44 * 2.1758823e-06 + dVar43 * -0.0016127247 + 4.12530561;
                local_4c8 = dVar34 * 294.80804 +
                            dVar2 * 1.85845025e-12 +
                            dVar33 * -6.06909735e-09 +
                            dVar44 * 7.05276303e-06 + dVar43 * -0.00237456025 + 4.30179801;
                dStack_4c0 = dVar34 * -17663.1465 +
                             dVar2 * 4.9430295e-13 +
                             dVar33 * -1.15645138e-09 +
                             dVar44 * -4.95004193e-08 + dVar43 * 0.0032846129 + 3.38875365;
                dVar40 = dVar2 * -5.01317694e-13 +
                         dVar33 * 1.74214532e-09 +
                         dVar44 * -2.11823211e-06 + dVar43 * 0.00173749123 + 3.38684249;
                dVar39 = dVar2 * -4.88971e-13 +
                         dVar33 * 1.41037875e-09 +
                         dVar44 * -1.321074e-06 + dVar43 * 0.00070412 + 3.298677;
                dVar35 = -30208.1133;
                dVar12 = -1020.9;
              }
              dVar31 = dVar2 * 0.0 + dVar33 * 0.0 + dVar44 * 0.0 + dVar43 * 0.0 + 2.5;
              local_4f8._8_4_ = SUB84(dVar37,0);
              local_4f8._0_8_ = dVar32;
              local_4f8._12_4_ = (int)((ulong)dVar37 >> 0x20);
              local_4e8 = dVar34 * dVar35 + dVar40;
              dStack_4e0 = dVar34 * 25471.627 + dVar31;
              local_4b8 = (undefined1 *)(dVar34 * dVar12 + dVar39);
              lVar17 = 0;
              do {
                *(double *)(local_2e0 + lVar17 * 8 + -8) =
                     local_210[lVar17] * *(double *)(local_4f8 + lVar17 * 8) *
                     *(double *)(local_488 + lVar17 * 8);
                lVar17 = lVar17 + 1;
              } while (lVar17 != 9);
              dVar34 = 0.0;
              lVar17 = 0;
              do {
                dVar34 = dVar34 + *(double *)(local_2e0 + lVar17 * 8 + -8);
                lVar17 = lVar17 + 1;
              } while (lVar17 != 9);
              local_488._0_8_ = 0x3fdfbefbefbefbf0;
              local_488._8_8_ = 0x3fa000418a43bf8c;
              local_478 = 0.055509297807382736;
              auStack_470._0_8_ = 0x3fefbefbefbefbf0;
              auStack_470._8_8_ = 0x3fb000418a43bf8c;
              dStack_460 = 0.05879931792791203;
              local_458 = 0.030297521662727988;
              dStack_450 = 0.029399658963956014;
              local_448 = &DAT_3fa246cdaf410bdd;
              if (1000.0 <= dVar43) {
                dVar32 = dVar2 * 1.58275179e-15 +
                         dVar33 * -9.23157818e-12 +
                         dVar44 * -5.63382869e-08 + dVar43 * 0.000700064411 + 2.99142337;
                dVar37 = dVar2 * -1.13643531e-15 +
                         dVar33 * 1.77528148e-11 +
                         dVar44 * -1.25884199e-07 + dVar43 * 0.000613519689 + 3.69757819;
                local_4d8 = (undefined1  [8])
                            (dVar2 * -4.3680515e-16 +
                            dVar33 * 4.55106742e-12 +
                            dVar44 * -3.10280335e-09 + dVar43 * -2.75506191e-05 + 2.54205966);
                uStack_4d0 = dVar2 * -1.33195876e-15 +
                             dVar33 * 3.05218674e-11 +
                             dVar44 * -2.59082758e-07 + dVar43 * 0.00105650448 + 2.86472886;
                local_4c8 = dVar2 * -1.07908535e-14 +
                            dVar33 * 1.1424637e-10 +
                            dVar44 * -6.3365815e-07 + dVar43 * 0.00223982013 + 4.0172109;
                dStack_4c0 = dVar2 * -1.43165356e-14 +
                             dVar33 * 2.34890357e-10 +
                             dVar44 * -1.47468882e-06 + dVar43 * 0.00433613639 + 4.57316685;
                dVar35 = dVar33 * 1.20099639e-10 +
                         dVar44 * -8.73026011e-07 + dVar43 * 0.00305629289 + 2.67214561;
                dVar12 = dVar33 * 1.009704e-10 +
                         dVar44 * -5.684761e-07 + dVar43 * 0.001487977 + 2.92664;
                dVar33 = -6.39161787e-15;
                dVar44 = -6.753351e-15;
              }
              else {
                dVar32 = dVar2 * 4.13487224e-13 +
                         dVar33 * -9.47543433e-11 +
                         dVar44 * -8.14301529e-07 + dVar43 * 0.000824944174 + 3.29812431;
                dVar37 = dVar2 * -8.76855392e-13 +
                         dVar33 * 1.31387723e-09 +
                         dVar44 * -5.75615047e-07 + dVar43 * 0.00112748635 + 3.2129364;
                local_4d8 = (undefined1  [8])
                            (dVar2 * 3.89069636e-13 +
                            dVar33 * -1.60284319e-09 +
                            dVar44 * 2.4210317e-06 + dVar43 * -0.00163816649 + 2.94642878);
                uStack_4d0 = dVar2 * 2.06237379e-12 +
                             dVar33 * -5.79853643e-09 +
                             dVar44 * 6.52764691e-06 + dVar43 * -0.00322544939 + 4.12530561;
                local_4c8 = dVar2 * 9.29225124e-12 +
                            dVar33 * -2.42763894e-08 +
                            dVar44 * 2.11582891e-05 + dVar43 * -0.00474912051 + 4.30179801;
                dStack_4c0 = dVar2 * 2.47151475e-12 +
                             dVar33 * -4.62580552e-09 +
                             dVar44 * -1.48501258e-07 + dVar43 * 0.00656922581 + 3.38875365;
                dVar35 = dVar33 * 6.96858127e-09 +
                         dVar44 * -6.35469633e-06 + dVar43 * 0.00347498246 + 3.38684249;
                dVar12 = dVar33 * 5.641515e-09 +
                         dVar44 * -3.963222e-06 + dVar43 * 0.00140824 + 3.298677;
                dVar33 = -2.50658847e-12;
                dVar44 = -2.444855e-12;
              }
              local_4f8._8_4_ = SUB84(dVar37,0);
              local_4f8._0_8_ = dVar32;
              local_4f8._12_4_ = (int)((ulong)dVar37 >> 0x20);
              local_4e8 = dVar2 * dVar33 + dVar35;
              dStack_4e0 = dVar31;
              local_4b8 = (undefined1 *)(dVar2 * dVar44 + dVar12);
              lVar17 = 0;
              do {
                *(double *)(local_2e0 + lVar17 * 8 + -8) =
                     *(double *)(local_4f8 + lVar17 * 8) * local_210[lVar17] *
                     *(double *)(local_488 + lVar17 * 8);
                lVar17 = lVar17 + 1;
              } while (lVar17 != 9);
              dVar2 = 0.0;
              lVar17 = 0;
              do {
                dVar2 = dVar2 + *(double *)(local_2e0 + lVar17 * 8 + -8);
                lVar17 = lVar17 + 1;
              } while (lVar17 != 9);
              dVar2 = (dVar42 - dVar43 * 83144626.1815324 * dVar34) / (dVar2 * 83144626.1815324);
              dVar33 = 100.0;
              if ((dVar2 <= 100.0) && (dVar33 = -100.0, -100.0 <= dVar2)) {
                if (ABS(dVar2) < 1e-06) break;
                dVar33 = dVar2;
                if ((dVar43 + dVar2 == dVar43) && (!NAN(dVar43 + dVar2) && !NAN(dVar43))) break;
              }
              dVar43 = dVar43 + dVar33;
              iVar15 = iVar15 + 1;
            } while (iVar15 != 200);
          }
          else {
            local_488._0_8_ = 0x3fdfbefbefbefbf0;
            local_488._8_8_ = 0x3fa000418a43bf8c;
            local_478 = 0.055509297807382736;
            auStack_470._0_8_ = 0x3fefbefbefbefbf0;
            auStack_470._8_8_ = 0x3fb000418a43bf8c;
            dStack_460 = 0.05879931792791203;
            local_458 = 0.030297521662727988;
            dStack_450 = 0.029399658963956014;
            local_448 = &DAT_3fa246cdaf410bdd;
            local_4f8._8_8_ = 0x4013ee5948eecbc4;
            local_4f8._0_8_ = 0x4012d18b04e469ef;
            local_4e8 = 6.979023715279999;
            dStack_4e0 = 2.5;
            local_4d8 = (undefined1  [8])0x40047e46d356025b;
            uStack_4d0 = 4.557840723039999;
            local_4c8 = 7.387270204000001;
            dStack_4c0 = 9.690641024400003;
            local_4b8 = (undefined1 *)0x4012109100dd8f57;
            lVar17 = 0;
            do {
              *(double *)(local_2e0 + lVar17 * 8 + -8) =
                   *(double *)(local_4f8 + lVar17 * 8) * local_210[lVar17] *
                   *(double *)(local_488 + lVar17 * 8);
              lVar17 = lVar17 + 1;
            } while (lVar17 != 9);
            dVar43 = 0.0;
            lVar17 = 0;
            do {
              dVar43 = dVar43 + *(double *)(local_2e0 + lVar17 * 8 + -8);
              lVar17 = lVar17 + 1;
            } while (lVar17 != 9);
            dVar43 = (dVar33 - dVar42) / (dVar43 * -83144626.1815324) + 4000.0;
          }
        }
        else {
          local_488._0_8_ = 0x3fdfbefbefbefbf0;
          local_488._8_8_ = 0x3fa000418a43bf8c;
          local_478 = 0.055509297807382736;
          auStack_470._0_8_ = 0x3fefbefbefbefbf0;
          auStack_470._8_8_ = 0x3fb000418a43bf8c;
          dStack_460 = 0.05879931792791203;
          local_458 = 0.030297521662727988;
          dStack_450 = 0.029399658963956014;
          local_448 = &DAT_3fa246cdaf410bdd;
          local_4f8._8_8_ = 0x400a7c35017f75d1;
          local_4f8._0_8_ = 0x400aed04a27c4796;
          local_4e8 = 3.6530335096033126;
          dStack_4e0 = 2.5;
          local_4d8 = (undefined1  [8])0x40068a2919e92027;
          uStack_4d0 = 3.8837972841578914;
          local_4c8 = 4.028671482541256;
          dStack_4c0 = 3.975571056568868;
          local_4b8 = (undefined1 *)0x400b2d9b3e474653;
          lVar17 = 0;
          do {
            *(double *)(local_2e0 + lVar17 * 8 + -8) =
                 *(double *)(local_4f8 + lVar17 * 8) * local_210[lVar17] *
                 *(double *)(local_488 + lVar17 * 8);
            lVar17 = lVar17 + 1;
          } while (lVar17 != 9);
          dVar43 = 0.0;
          lVar17 = 0;
          do {
            dVar43 = dVar43 + *(double *)(local_2e0 + lVar17 * 8 + -8);
            lVar17 = lVar17 + 1;
          } while (lVar17 != 9);
          dVar43 = (dVar2 - dVar42) / (dVar43 * -83144626.1815324) + 90.0;
        }
        dVar33 = dVar43 * dVar43;
        dVar2 = dVar43 * dVar33;
        dVar42 = dVar43 * dVar2;
        local_4f8._8_8_ = 0x3fa000418a43bf8c;
        local_4f8._0_8_ = 0x3fdfbefbefbefbf0;
        local_4e8 = 0.055509297807382736;
        dStack_4e0 = 0.9920634920634921;
        uStack_4d0 = 0.05879931792791203;
        local_4d8 = (undefined1  [8])0x3fb000418a43bf8c;
        local_4c8 = 0.030297521662727988;
        dStack_4c0 = 0.029399658963956014;
        local_4b8 = &DAT_3fa246cdaf410bdd;
        dVar44 = 1.0 / dVar43;
        if (1000.0 <= dVar43) {
          dVar12 = dVar44 * -835.033997 +
                   dVar42 * 3.16550358e-16 +
                   dVar2 * -2.30789455e-12 +
                   dVar33 * -1.8779429e-08 + dVar43 * 0.000350032206 + 2.99142337;
          dVar32 = dVar44 * -1233.93018 +
                   dVar42 * -2.27287062e-16 +
                   dVar2 * 4.4382037e-12 +
                   dVar33 * -4.19613997e-08 + dVar43 * 0.000306759845 + 3.69757819;
          local_238._0_8_ =
               dVar44 * 29230.8027 +
               dVar42 * -8.736103e-17 +
               dVar2 * 1.13776685e-12 +
               dVar33 * -1.03426778e-09 + dVar43 * -1.37753096e-05 + 2.54205966;
          local_238._8_8_ =
               dVar44 * 3683.62875 +
               dVar42 * -2.66391752e-16 +
               dVar2 * 7.63046685e-12 +
               dVar33 * -8.63609193e-08 + dVar43 * 0.00052825224 + 2.86472886;
          local_228 = dVar44 * 111.856713 +
                      dVar42 * -2.1581707e-15 +
                      dVar2 * 2.85615925e-11 +
                      dVar33 * -2.11219383e-07 + dVar43 * 0.00111991006 + 4.0172109;
          dStack_220 = dVar44 * -18006.9609 +
                       dVar42 * -2.86330712e-15 +
                       dVar2 * 5.87225893e-11 +
                       dVar33 * -4.9156294e-07 + dVar43 * 0.0021680682 + 4.57316685;
          dVar37 = dVar42 * -1.27832357e-15 +
                   dVar2 * 3.00249098e-11 +
                   dVar33 * -2.9100867e-07 + dVar43 * 0.00152814644 + 2.67214561;
          dVar40 = dVar42 * -1.3506702e-15 +
                   dVar2 * 2.52426e-11 + dVar33 * -1.89492033e-07 + dVar43 * 0.0007439885 + 2.92664;
          dVar34 = -29899.209;
          dVar35 = -922.7977;
        }
        else {
          dVar12 = dVar44 * -1012.52087 +
                   dVar42 * 8.26974448e-14 +
                   dVar2 * -2.36885858e-11 +
                   dVar33 * -2.71433843e-07 + dVar43 * 0.000412472087 + 3.29812431;
          dVar32 = dVar44 * -1005.24902 +
                   dVar42 * -1.75371078e-13 +
                   dVar2 * 3.28469308e-10 +
                   dVar33 * -1.91871682e-07 + dVar43 * 0.000563743175 + 3.2129364;
          local_238._0_8_ =
               dVar44 * 29147.6445 +
               dVar42 * 7.78139272e-14 +
               dVar2 * -4.00710797e-10 +
               dVar33 * 8.07010567e-07 + dVar43 * -0.000819083245 + 2.94642878;
          local_238._8_8_ =
               dVar44 * 3346.30913 +
               dVar42 * 4.12474758e-13 +
               dVar2 * -1.44963411e-09 +
               dVar33 * 2.1758823e-06 + dVar43 * -0.0016127247 + 4.12530561;
          local_228 = dVar44 * 294.80804 +
                      dVar42 * 1.85845025e-12 +
                      dVar2 * -6.06909735e-09 +
                      dVar33 * 7.05276303e-06 + dVar43 * -0.00237456025 + 4.30179801;
          dStack_220 = dVar44 * -17663.1465 +
                       dVar42 * 4.9430295e-13 +
                       dVar2 * -1.15645138e-09 +
                       dVar33 * -4.95004193e-08 + dVar43 * 0.0032846129 + 3.38875365;
          dVar37 = dVar42 * -5.01317694e-13 +
                   dVar2 * 1.74214532e-09 +
                   dVar33 * -2.11823211e-06 + dVar43 * 0.00173749123 + 3.38684249;
          dVar40 = dVar42 * -4.88971e-13 +
                   dVar2 * 1.41037875e-09 + dVar33 * -1.321074e-06 + dVar43 * 0.00070412 + 3.298677;
          dVar34 = -30208.1133;
          dVar35 = -1020.9;
        }
        dStack_4e0 = dVar42 * 0.0 + dVar2 * 0.0 + dVar33 * 0.0 + dVar43 * 0.0 + 2.5;
        local_258._8_4_ = SUB84(dVar32,0);
        local_258._0_8_ = dVar12;
        local_258._12_4_ = (int)((ulong)dVar32 >> 0x20);
        local_248 = dVar44 * dVar34 + dVar37;
        dStack_240 = dVar44 * 25471.627 + dStack_4e0;
        local_218 = dVar44 * dVar35 + dVar40;
        lVar17 = 0;
        do {
          *(double *)(local_258 + lVar17 * 8) =
               *(double *)(local_4f8 + lVar17 * 8) * dVar43 * 83144626.1815324 *
               *(double *)(local_258 + lVar17 * 8);
          lVar17 = lVar17 + 1;
        } while (lVar17 != 9);
        local_488._8_8_ = 0x3fa000418a43bf8c;
        local_488._0_8_ = 0x3fdfbefbefbefbf0;
        local_478 = 0.055509297807382736;
        auStack_470._8_8_ = 0x3fb000418a43bf8c;
        auStack_470._0_8_ = 0x3fefbefbefbefbf0;
        dStack_460 = 0.05879931792791203;
        local_458 = 0.030297521662727988;
        dStack_450 = 0.029399658963956014;
        local_448 = &DAT_3fa246cdaf410bdd;
        if (1000.0 <= dVar43) {
          dVar35 = dVar42 * 1.58275179e-15 +
                   dVar2 * -9.23157818e-12 +
                   dVar33 * -5.63382869e-08 + dVar43 * 0.000700064411 + 2.99142337;
          dVar12 = dVar42 * -1.13643531e-15 +
                   dVar2 * 1.77528148e-11 +
                   dVar33 * -1.25884199e-07 + dVar43 * 0.000613519689 + 3.69757819;
          dVar32 = dVar42 * -4.3680515e-16 +
                   dVar2 * 4.55106742e-12 +
                   dVar33 * -3.10280335e-09 + dVar43 * -2.75506191e-05 + 2.54205966;
          dVar37 = dVar42 * -1.33195876e-15 +
                   dVar2 * 3.05218674e-11 +
                   dVar33 * -2.59082758e-07 + dVar43 * 0.00105650448 + 2.86472886;
          local_4c8 = dVar42 * -1.07908535e-14 +
                      dVar2 * 1.1424637e-10 +
                      dVar33 * -6.3365815e-07 + dVar43 * 0.00223982013 + 4.0172109;
          dStack_4c0 = dVar42 * -1.43165356e-14 +
                       dVar2 * 2.34890357e-10 +
                       dVar33 * -1.47468882e-06 + dVar43 * 0.00433613639 + 4.57316685;
          dVar44 = dVar2 * 1.20099639e-10 +
                   dVar33 * -8.73026011e-07 + dVar43 * 0.00305629289 + 2.67214561;
          dVar34 = dVar2 * 1.009704e-10 + dVar33 * -5.684761e-07 + dVar43 * 0.001487977 + 2.92664;
          dVar2 = -6.39161787e-15;
          dVar33 = -6.753351e-15;
        }
        else {
          dVar35 = dVar42 * 4.13487224e-13 +
                   dVar2 * -9.47543433e-11 +
                   dVar33 * -8.14301529e-07 + dVar43 * 0.000824944174 + 3.29812431;
          dVar12 = dVar42 * -8.76855392e-13 +
                   dVar2 * 1.31387723e-09 +
                   dVar33 * -5.75615047e-07 + dVar43 * 0.00112748635 + 3.2129364;
          dVar32 = dVar42 * 3.89069636e-13 +
                   dVar2 * -1.60284319e-09 +
                   dVar33 * 2.4210317e-06 + dVar43 * -0.00163816649 + 2.94642878;
          dVar37 = dVar42 * 2.06237379e-12 +
                   dVar2 * -5.79853643e-09 +
                   dVar33 * 6.52764691e-06 + dVar43 * -0.00322544939 + 4.12530561;
          local_4c8 = dVar42 * 9.29225124e-12 +
                      dVar2 * -2.42763894e-08 +
                      dVar33 * 2.11582891e-05 + dVar43 * -0.00474912051 + 4.30179801;
          dStack_4c0 = dVar42 * 2.47151475e-12 +
                       dVar2 * -4.62580552e-09 +
                       dVar33 * -1.48501258e-07 + dVar43 * 0.00656922581 + 3.38875365;
          dVar44 = dVar2 * 6.96858127e-09 +
                   dVar33 * -6.35469633e-06 + dVar43 * 0.00347498246 + 3.38684249;
          dVar34 = dVar2 * 5.641515e-09 + dVar33 * -3.963222e-06 + dVar43 * 0.00140824 + 3.298677;
          dVar2 = -2.50658847e-12;
          dVar33 = -2.444855e-12;
        }
        local_4f8._8_4_ = SUB84(dVar12,0);
        local_4f8._0_8_ = dVar35;
        local_4f8._12_4_ = (int)((ulong)dVar12 >> 0x20);
        local_4e8 = dVar42 * dVar2 + dVar44;
        unique0x100098c1 = SUB84(dVar37,0);
        local_4d8 = (undefined1  [8])dVar32;
        unique0x100098c5 = (int)((ulong)dVar37 >> 0x20);
        local_4b8 = (undefined1 *)(dVar42 * dVar33 + dVar34);
        lVar17 = 0;
        do {
          *(double *)(local_2e0 + lVar17 * 8 + -8) =
               *(double *)(local_4f8 + lVar17 * 8) * local_210[lVar17] *
               *(double *)(local_488 + lVar17 * 8);
          lVar17 = lVar17 + 1;
        } while (lVar17 != 9);
        local_420 = 0.0;
        lVar17 = 0;
        do {
          local_420 = local_420 + *(double *)(local_2e0 + lVar17 * 8 + -8);
          lVar17 = lVar17 + 1;
        } while (lVar17 != 9);
        local_420 = local_420 * 83144626.1815324;
      }
      else {
        amrex::Abort_host("Wrong reactor type. Choose between 1 (e) or 2 (h).");
        dVar9 = local_408._0_8_;
        local_420 = 0.0;
      }
      local_4f8._0_8_ = 0x3fdfbefbefbefbf0;
      local_4f8._8_8_ = 0x3fa000418a43bf8c;
      local_4e8 = 0.055509297807382736;
      dStack_4e0 = 0.9920634920634921;
      local_4d8 = (undefined1  [8])0x3fb000418a43bf8c;
      uStack_4d0 = 0.05879931792791203;
      local_4c8 = 0.030297521662727988;
      dStack_4c0 = 0.029399658963956014;
      local_4b8 = &DAT_3fa246cdaf410bdd;
      lVar17 = 0;
      do {
        *(double *)(local_2e0 + lVar17 * 8 + -8) =
             local_210[lVar17] * dVar9 * *(double *)(local_4f8 + lVar17 * 8);
        lVar17 = lVar17 + 1;
      } while (lVar17 != 9);
      lVar17 = 0;
      do {
        *(double *)(local_2e0 + lVar17 * 8 + -8) =
             *(double *)(local_2e0 + lVar17 * 8 + -8) * 1000000.0;
        lVar17 = lVar17 + 1;
      } while (lVar17 != 9);
      local_b8 = log(dVar43);
      uStack_b0 = CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc);
      local_488 = ZEXT816(0);
      local_478 = 0.0;
      auStack_470 = ZEXT816(0);
      dStack_460 = 0.0;
      local_458 = 0.0;
      dStack_450 = 0.0;
      local_448 = (undefined1 *)0x0;
      dVar9 = 0.0;
      lVar17 = 0;
      do {
        dVar9 = dVar9 + *(double *)(local_2e0 + lVar17 * 8 + -8);
        lVar17 = lVar17 + 1;
      } while (lVar17 != 9);
      dVar2 = dVar43 * dVar43;
      dVar42 = dVar43 * dVar2;
      dVar33 = dVar43 * dVar42;
      local_98 = 1.0 / dVar43;
      local_3f8._8_8_ = 0;
      local_3f8._0_8_ = local_98 * 12186.6002121605;
      uStack_90 = 0;
      if (1000.0 <= dVar43) {
        dVar34 = dVar42 * -1.479401233333333e-12 +
                 dVar2 * 2.098069983333333e-08 +
                 dVar43 * -0.0003067598445 +
                 local_b8 * -3.69757819 + local_98 * -1233.93018 + 0.5084126000000002;
        dVar35 = dVar42 * 7.692981816666667e-13 +
                 dVar2 * 9.389714483333333e-09 +
                 dVar43 * -0.0003500322055 +
                 local_b8 * -2.99142337 + local_98 * -835.033997 + 4.34653354;
        dVar44 = dVar33 * 6.6597938e-17 +
                 dVar42 * -2.54348895e-12 +
                 dVar2 * 4.318045966666667e-08 +
                 dVar43 * -0.00052825224 +
                 local_b8 * -2.86472886 + local_98 * 3683.62875 + -2.83691187;
        local_318._8_4_ = SUB84(dVar44,0);
        local_318._0_8_ =
             dVar33 * 5.39542675e-16 +
             dVar42 * -9.520530833333334e-12 +
             dVar2 * 1.056096916666667e-07 +
             dVar43 * -0.001119910065 +
             local_b8 * -4.0172109 + local_98 * 111.856713 + 0.2321087500000001;
        local_318._12_4_ = (int)((ulong)dVar44 >> 0x20);
        dVar44 = dVar33 * -0.0 +
                 dVar42 * -0.0 +
                 dVar2 * -0.0 + dVar43 * -0.0 + local_b8 * -2.5 + local_98 * 25471.627 + 2.960117638
        ;
        local_288._8_4_ = SUB84(dVar44,0);
        local_288._0_8_ =
             dVar33 * 2.18402575e-17 +
             dVar42 * -3.792556183333333e-13 +
             dVar2 * 5.171338916666667e-10 +
             dVar43 * 1.377530955e-05 + local_b8 * -2.54205966 + local_98 * 29230.8027 + -2.37824845
        ;
        local_288._12_4_ = (int)((ulong)dVar44 >> 0x20);
        dVar44 = dVar33 * 7.1582678e-16 +
                 dVar42 * -1.957419641666667e-11 +
                 dVar2 * 2.4578147e-07 +
                 dVar43 * -0.002168068195 +
                 local_b8 * -4.57316685 + local_98 * -18006.9609 + 4.072029891;
        local_278._8_4_ = SUB84(dVar44,0);
        local_278._0_8_ =
             dVar33 * 3.195808935e-16 +
             dVar42 * -1.000830325e-11 +
             dVar2 * 1.455043351666667e-07 +
             dVar43 * -0.001528146445 +
             local_b8 * -2.67214561 + local_98 * -29899.209 + -4.190671200000001;
        local_278._12_4_ = (int)((ulong)dVar44 >> 0x20);
        dVar42 = 5.68217655e-17;
        dVar2 = -7.91375895e-17;
      }
      else {
        dVar34 = dVar42 * -1.094897691666667e-10 +
                 dVar2 * 9.593584116666666e-08 +
                 dVar43 * -0.000563743175 +
                 local_b8 * -3.2129364 + local_98 * -1005.24902 + -2.82180119;
        dVar35 = dVar42 * 7.896195275e-12 +
                 dVar2 * 1.357169215e-07 +
                 dVar43 * -0.000412472087 +
                 local_b8 * -3.29812431 + local_98 * -1012.52087 + 6.5922184;
        dVar44 = dVar33 * -1.031186895e-13 +
                 dVar42 * 4.832113691666666e-10 +
                 dVar2 * -1.087941151666667e-06 +
                 dVar43 * 0.001612724695 +
                 local_b8 * -4.12530561 + local_98 * 3346.30913 + 4.81573857;
        local_318._8_4_ = SUB84(dVar44,0);
        local_318._0_8_ =
             dVar33 * -4.646125620000001e-13 +
             dVar42 * 2.02303245e-09 +
             dVar2 * -3.526381516666666e-06 +
             dVar43 * 0.002374560255 +
             local_b8 * -4.30179801 + local_98 * 294.80804 + 0.5851355599999999;
        local_318._12_4_ = (int)((ulong)dVar44 >> 0x20);
        dVar44 = dVar33 * -0.0 +
                 dVar42 * -0.0 +
                 dVar2 * -0.0 + dVar43 * -0.0 + local_b8 * -2.5 + local_98 * 25471.627 + 2.960117608
        ;
        local_288._8_4_ = SUB84(dVar44,0);
        local_288._0_8_ =
             dVar33 * -1.94534818e-14 +
             dVar42 * 1.335702658333333e-10 +
             dVar2 * -4.035052833333333e-07 +
             dVar43 * 0.000819083245 +
             local_b8 * -2.94642878 + local_98 * 29147.6445 + -0.01756619999999964;
        local_288._12_4_ = (int)((ulong)dVar44 >> 0x20);
        dVar44 = dVar33 * -1.235757375e-13 +
                 dVar42 * 3.854837933333333e-10 +
                 dVar2 * 2.475020966666667e-08 +
                 dVar43 * -0.003284612905 +
                 local_b8 * -3.38875365 + local_98 * -17663.1465 + -3.39660955;
        local_278._8_4_ = SUB84(dVar44,0);
        local_278._0_8_ =
             dVar33 * 1.253294235e-13 +
             dVar42 * -5.807151058333333e-10 +
             dVar2 * 1.059116055e-06 +
             dVar43 * -0.00173749123 +
             local_b8 * -3.38684249 + local_98 * -30208.1133 + 0.7966096399999998;
        local_278._12_4_ = (int)((ulong)dVar44 >> 0x20);
        dVar42 = 4.38427696e-14;
        dVar2 = -2.06743612e-14;
      }
      dVar34 = dVar33 * dVar42 + dVar34;
      dVar35 = dVar33 * dVar2 + dVar35;
      local_3e8._0_8_ = 1.0 / (local_98 * 12186.6002121605);
      dVar2 = exp(local_b8 * 0.6);
      local_498._8_8_ = 0;
      local_498._0_8_ = local_2e8;
      dVar12 = dVar9 + local_2e8;
      dVar33 = exp(local_b8 * -1.72 + local_98 * -264.088106214317);
      uVar24 = SUB84(dVar35,0);
      uVar26 = (uint)((ulong)dVar35 >> 0x20);
      local_378._8_4_ = local_498._8_4_;
      local_378._0_8_ = local_498._0_8_ * 1.5 + dVar9;
      local_378._12_4_ = local_498._12_4_;
      uVar25 = (undefined4)uStack_b0;
      uVar27 = (uint)((ulong)uStack_b0 >> 0x20);
      local_3b8._8_4_ = uVar25;
      local_3b8._0_8_ = local_b8 * 0.0 + local_98 * -22896.3582941147;
      local_3b8._12_4_ = uVar27;
      dVar42 = local_318._8_8_;
      local_408._8_4_ = local_318._8_4_;
      local_408._0_8_ = dVar42;
      local_408._12_4_ = local_318._12_4_;
      dVar44 = dVar42 * -2.0;
      local_398._8_4_ = uVar25;
      local_398._0_8_ = local_b8 * -1.4 + local_98 * -52525.7555766966;
      local_398._12_4_ = uVar27;
      dVar9 = local_278._0_8_;
      dVar32 = local_278._8_8_;
      dVar31 = dVar9 + (double)local_288._0_8_;
      local_198._8_4_ = uVar25;
      local_198._0_8_ = local_b8 * -0.406 + local_98 * -8352.89343569254;
      local_198._12_4_ = uVar27;
      local_128._8_4_ = uVar25;
      local_128._0_8_ = local_b8 * 2.67 + local_98 * -3165.23282791169;
      local_128._12_4_ = uVar27;
      local_118._8_4_ = uVar25;
      local_118._0_8_ = local_b8 * 1.51 + local_98 * -1726.03316371019;
      local_118._12_4_ = uVar27;
      local_108._8_4_ = uVar25;
      local_108._0_8_ = local_b8 * 2.02 + local_98 * -6743.10332178324;
      local_108._12_4_ = uVar27;
      local_388 = local_2e0;
      local_268._8_4_ = local_2e0._8_4_;
      local_268._0_8_ = local_2e0._8_8_;
      local_268._12_4_ = local_2e0._12_4_;
      dVar33 = dVar33 * ((local_2e0._8_8_ * 10.0 + local_2e0._0_8_ * -0.22 + dVar12) /
                        (dVar2 * 1475000.0)) * 636600000.0;
      local_e8._8_4_ = uVar24;
      local_e8._0_8_ = -((dVar34 + (double)local_288._8_8_) - (double)local_318._0_8_);
      local_e8._12_4_ = uVar26 ^ 0x80000000;
      uVar28 = (undefined4)uStack_90;
      uVar29 = (undefined4)((ulong)uStack_90 >> 0x20);
      local_418._8_4_ = uVar28;
      local_418._0_8_ = local_98 * -24370.7831249226;
      local_418._12_4_ = uVar29;
      local_a8._8_4_ = local_278._8_4_;
      local_a8._0_8_ = dVar32;
      local_a8._12_4_ = local_278._12_4_;
      local_1c8 = -(dVar35 - ((double)local_288._8_8_ + (double)local_288._8_8_));
      dStack_1c0 = -dVar35;
      local_1b8._8_4_ = uVar25;
      local_1b8._0_8_ = local_b8 * -0.5;
      local_1b8._12_4_ = uVar27;
      uVar14 = local_288._12_4_;
      uVar30 = local_288._8_4_;
      local_358._8_4_ = uVar30;
      local_358._0_8_ = -(((double)local_288._0_8_ + (double)local_288._0_8_) - dVar34);
      uStack_34c = uVar14 ^ 0x80000000;
      local_1a8._8_4_ = uVar25;
      local_1a8._0_8_ = -local_b8;
      local_1a8._12_4_ = uVar27 ^ 0x80000000;
      local_438._8_4_ = uVar30;
      local_438._0_8_ = -(((double)local_288._8_8_ + (double)local_288._0_8_) - dVar42);
      local_438._12_4_ = uVar14 ^ 0x80000000;
      local_348._8_8_ = uStack_b0;
      local_348._0_8_ = local_b8 * -2.0;
      local_338._8_4_ = uVar30;
      local_338._0_8_ = -(((double)local_288._8_8_ - dVar9) + dVar42);
      local_338._12_4_ = uVar14 ^ 0x80000000;
      dVar12 = (dVar34 + (double)local_288._8_8_) - (double)local_288._0_8_;
      local_188._8_8_ = -dVar35;
      local_188._0_8_ = -(((dVar35 - (double)local_288._8_8_) + (double)local_288._0_8_) - dVar42);
      local_178._8_8_ = -dVar35;
      local_178._0_8_ = -(((dVar35 - dVar9) - (double)local_288._8_8_) + dVar42);
      local_328._8_4_ = uVar28;
      local_328._0_8_ = local_98 * -414.147315957284;
      local_328._12_4_ = uVar29;
      local_3d8._8_4_ = uVar24;
      local_3d8._0_8_ = -((-dVar35 - dVar34) + (double)local_288._8_8_ + (double)local_318._0_8_);
      local_3d8._12_4_ = uVar26;
      local_168._8_4_ = uVar28;
      local_168._0_8_ = local_98 * -148.448916412392;
      local_168._12_4_ = uVar29;
      local_3c8._8_8_ = -dVar42;
      local_3c8._0_8_ = -(dVar44 + (double)local_288._8_8_ + (double)local_318._0_8_);
      local_158._8_4_ = uVar30;
      local_158._0_8_ = -((((double)local_288._0_8_ - dVar34) - dVar42) + (double)local_318._0_8_);
      local_158._12_4_ = uVar14 ^ 0x80000000;
      local_148._8_4_ = uVar28;
      local_148._0_8_ = local_98 * 250.098682904946;
      local_148._12_4_ = uVar29;
      local_138._8_4_ = uVar24;
      local_138._0_8_ = -((-dVar34 - dVar9) + dVar42 + (double)local_318._0_8_);
      local_138._12_4_ = uVar26;
      local_f8._8_4_ = uVar28;
      local_f8._0_8_ = local_98 * -6029.54208967215;
      local_f8._12_4_ = uVar29;
      local_298._8_4_ = local_318._8_4_;
      local_298._0_8_ = -((((double)local_318._0_8_ + (double)local_318._0_8_) - dVar34) - dVar32);
      local_298._12_4_ = local_318._12_4_ ^ 0x80000000;
      local_d8._8_4_ = uVar28;
      local_d8._0_8_ = local_98 * 819.89091359563;
      local_d8._12_4_ = uVar29;
      local_58._8_4_ = uVar28;
      local_58._0_8_ = local_98 * -1997.77016324474;
      local_58._12_4_ = uVar29;
      local_3a8._8_8_ = -(double)local_288._8_8_;
      local_3a8._0_8_ = -((((double)local_288._8_8_ - dVar9) - dVar42) + dVar32);
      local_c8._8_8_ = uStack_90;
      local_c8._0_8_ = local_98 * -4000.57249314752;
      local_48 = -((((double)local_288._8_8_ - dVar35) - (double)local_318._0_8_) + dVar32);
      dStack_40 = -(double)local_288._8_8_;
      local_4a8._0_8_ = dVar33 / (dVar33 + 1.0);
      dVar9 = log10(dVar33);
      dVar33 = exp(dVar43 * -1e+30);
      dVar34 = exp(dVar43 * -1e-30);
      dVar33 = log10(dVar34 * 0.8 + dVar33 * 0.2 + 0.0);
      dVar9 = dVar33 * -0.67 + -0.4 + dVar9;
      dVar9 = dVar9 / (dVar9 * -0.14 + dVar33 * -1.27 + 0.75);
      dVar9 = pow(10.0,dVar33 / (dVar9 * dVar9 + 1.0));
      dVar2 = dVar9 * (double)local_4a8._0_8_ * dVar2 * 1475000.0;
      dVar9 = exp((double)local_e8._0_8_);
      local_4a8._0_8_ = dVar9 * dVar2 * (double)local_3f8._0_8_;
      dVar9 = exp((double)local_418._0_8_);
      dVar34 = local_268._0_8_ * 11.0 + (double)local_378._0_8_;
      local_418._8_4_ = local_268._8_4_;
      local_418._0_8_ = dVar34;
      local_418._12_4_ = local_268._12_4_;
      dVar33 = exp((double)local_3b8._0_8_);
      dVar33 = dVar33 * (dVar34 / (dVar9 * 295100000000000.0)) * 120200000000.0;
      local_3b8._0_8_ = dVar33;
      dVar33 = log10(dVar33);
      dVar34 = exp(dVar43 * -1e+30);
      dVar43 = exp(dVar43 * -1e-30);
      dVar43 = log10(dVar43 * 0.5 + dVar34 * 0.5 + 0.0);
      dVar33 = dVar43 * -0.67 + -0.4 + dVar33;
      dVar33 = dVar33 / (dVar33 * -0.14 + dVar43 * -1.27 + 0.75);
      dVar43 = pow(10.0,dVar43 / (dVar33 * dVar33 + 1.0));
      dVar33 = exp(-(dVar44 + dVar32));
      dVar4 = local_2b0;
      auVar1 = local_2c0;
      dVar35 = local_2c0._8_8_;
      local_378._8_4_ = local_2c0._8_4_;
      local_378._0_8_ = dVar35;
      local_378._12_4_ = local_2c0._12_4_;
      local_4a8._0_8_ = (double)local_4a8._0_8_ * dVar35;
      dVar43 = ((double)local_3b8._0_8_ / ((double)local_3b8._0_8_ + 1.0)) * dVar43 *
               dVar9 * 295100000000000.0;
      dVar9 = local_2c0._0_8_;
      local_e8._8_4_ = SUB84(dVar35 * dVar35,0);
      local_e8._0_8_ = dVar9 * dVar9;
      local_e8._12_4_ = (int)((ulong)(dVar35 * dVar35) >> 0x20);
      dVar32 = local_2b0 * dVar43 - dVar43 * dVar33 * (double)local_3e8._0_8_ * dVar9 * dVar9;
      dVar43 = dStack_450 - dVar32;
      dVar33 = exp((double)local_398._0_8_);
      dVar33 = dVar33 * 45770000000000.0 * (double)local_418._0_8_;
      local_398._8_4_ = local_498._8_4_;
      local_398._0_8_ = local_498._0_8_ * dVar33;
      local_398._12_4_ = local_498._12_4_;
      dVar34 = exp(local_1c8);
      local_70 = dVar34 * dVar33 * (double)local_3e8._0_8_;
      local_3e8._8_8_ = 0;
      local_3e8._0_8_ = local_488._0_8_;
      dStack_1c0 = exp((double)local_1b8._0_8_);
      dStack_1c0 = dStack_1c0 * 6165.0;
      local_1c8 = 3547000000.0;
      local_68 = exp((double)local_358._0_8_);
      local_3b8._8_8_ = 0;
      local_3b8._0_8_ = auStack_470._8_8_;
      dVar33 = exp((double)local_1a8._0_8_);
      local_1b8._8_4_ = extraout_XMM0_Dc_00;
      local_1b8._0_8_ = dVar33;
      local_1b8._12_4_ = extraout_XMM0_Dd_00;
      dVar33 = exp((double)local_438._0_8_);
      local_1a8._8_4_ = extraout_XMM0_Dc_01;
      local_1a8._0_8_ = dVar33;
      local_1a8._12_4_ = extraout_XMM0_Dd_01;
      dVar33 = exp((double)local_348._0_8_);
      local_348._8_4_ = extraout_XMM0_Dc_02;
      local_348._0_8_ = dVar33;
      local_348._12_4_ = extraout_XMM0_Dd_02;
      local_548 = auVar1._0_4_;
      uStack_544 = auVar1._4_4_;
      local_358._8_4_ = local_548;
      local_358._0_8_ = dVar9;
      uStack_34c = uStack_544;
      dVar33 = exp((double)local_338._0_8_);
      dVar3 = local_478;
      local_338._8_4_ = extraout_XMM0_Dc_03;
      local_338._0_8_ = dVar33;
      local_338._12_4_ = extraout_XMM0_Dd_03;
      dVar33 = exp((double)local_198._0_8_);
      local_438._8_4_ = extraout_XMM0_Dc_04;
      local_438._0_8_ = dVar33;
      local_438._12_4_ = extraout_XMM0_Dd_04;
      dVar42 = exp(-(dVar12 - dVar42));
      dVar12 = local_2d0._8_8_;
      dVar34 = local_2d0._0_8_;
      dVar37 = dVar2 * (double)local_388._0_8_ * dVar34 - (double)local_4a8._0_8_;
      dVar40 = (double)local_398._0_8_ - dVar34 * dVar34 * local_70;
      dVar2 = (double)local_438._0_8_ * local_1c8;
      local_438._8_4_ = local_2d0._8_4_;
      local_438._0_8_ = dVar12;
      local_438._12_4_ = local_2d0._12_4_;
      dVar36 = 0.0 - dVar37;
      local_3e8._0_8_ = (double)local_3e8._0_8_ - dVar40;
      dVar10 = (double)local_388._0_8_ * dVar34 * dVar2 - dVar9 * dVar12 * dVar2 * dVar42;
      dVar11 = dVar12 * dVar12 * (double)local_418._0_8_ * dStack_1c0 -
               (double)local_388._0_8_ *
               (double)local_418._0_8_ * dStack_1c0 * local_68 * (double)local_3f8._0_8_;
      uVar24 = local_3b8._12_4_;
      dVar42 = dVar34 * (double)local_358._0_8_;
      dVar2 = (double)local_388._0_8_ * stack0xfffffffffffffcb0;
      local_358._8_4_ = SUB84(dVar2,0);
      local_358._0_8_ = dVar42;
      uStack_34c = (int)((ulong)dVar2 >> 0x20);
      dVar2 = (double)local_418._0_8_ * (double)local_1b8._0_8_ * 4714000.0;
      dVar33 = (double)local_418._0_8_ * (double)local_348._0_8_ * 38000000000.0;
      dVar12 = dVar34 * dVar12 * dVar2 -
               dVar9 * (double)local_3f8._0_8_ * (double)local_1a8._0_8_ * dVar2;
      dVar39 = dVar42 * dVar33 -
               (double)local_388._8_8_ * (double)local_3f8._0_8_ * (double)local_338._0_8_ * dVar33;
      local_3b8._8_4_ = local_3b8._8_4_;
      local_3b8._0_8_ = (local_3b8._0_8_ - (dVar11 + dVar11)) - dVar12;
      local_3b8._12_4_ = uVar24;
      local_348._8_8_ = local_388._0_8_;
      local_348._0_8_ = local_388._8_8_;
      local_198._8_4_ = SUB84(dVar11,0);
      local_198._0_8_ = dVar10;
      local_198._12_4_ = (int)((ulong)dVar11 >> 0x20);
      local_338._8_8_ = 0;
      local_338._0_8_ = (dVar36 + dVar11) - dVar10;
      local_398._0_8_ = (((dVar40 + dVar40 + dVar36) - dVar12) - dVar39) - dVar10;
      dVar42 = exp((double)local_128._0_8_);
      local_418._8_4_ = extraout_XMM0_Dc_05;
      local_418._0_8_ = dVar42 * 0.0508;
      local_418._12_4_ = extraout_XMM0_Dd_05;
      dVar42 = exp((double)local_188._0_8_);
      local_188._8_4_ = extraout_XMM0_Dc_06;
      local_188._0_8_ = dVar42;
      local_188._12_4_ = extraout_XMM0_Dd_06;
      dVar42 = exp((double)local_118._0_8_);
      local_4a8._8_4_ = extraout_XMM0_Dc_07;
      local_4a8._0_8_ = dVar42;
      local_4a8._12_4_ = extraout_XMM0_Dd_07;
      dVar42 = exp((double)local_178._0_8_);
      local_178._8_4_ = extraout_XMM0_Dc_08;
      local_178._0_8_ = dVar42;
      local_178._12_4_ = extraout_XMM0_Dd_08;
      dVar42 = exp((double)local_108._0_8_);
      local_118._8_4_ = extraout_XMM0_Dc_09;
      local_118._0_8_ = dVar42;
      local_118._12_4_ = extraout_XMM0_Dd_09;
      dVar42 = exp(-(dVar31 + dVar44));
      local_108._8_4_ = extraout_XMM0_Dc_10;
      local_108._0_8_ = dVar42;
      local_108._12_4_ = extraout_XMM0_Dd_10;
      dVar42 = exp((double)local_328._0_8_);
      local_3f8._8_4_ = extraout_XMM0_Dc_11;
      local_3f8._0_8_ = dVar42;
      local_3f8._12_4_ = extraout_XMM0_Dd_11;
      dVar42 = exp((double)local_3d8._0_8_);
      local_328._8_4_ = extraout_XMM0_Dc_12;
      local_328._0_8_ = dVar42;
      local_328._12_4_ = extraout_XMM0_Dd_12;
      dVar42 = exp((double)local_168._0_8_);
      local_168._8_4_ = extraout_XMM0_Dc_13;
      local_168._0_8_ = dVar42;
      local_168._12_4_ = extraout_XMM0_Dd_13;
      dVar42 = exp((double)local_3c8._0_8_);
      local_128._8_4_ = extraout_XMM0_Dc_14;
      local_128._0_8_ = dVar42;
      local_128._12_4_ = extraout_XMM0_Dd_14;
      dVar42 = dVar35 * (double)local_438._8_8_ * 32500000.0;
      local_3c8._8_4_ = SUB84(dVar42,0);
      local_3c8._0_8_ = (double)local_418._0_8_ * (double)local_498._0_8_ * (double)local_438._0_8_;
      local_3c8._12_4_ = (int)((ulong)dVar42 >> 0x20);
      dVar42 = exp((double)local_158._0_8_);
      dVar44 = (double)local_3c8._0_8_ -
               (double)local_188._0_8_ * (double)local_418._0_8_ * (double)local_358._0_8_;
      dVar42 = (double)local_3c8._8_8_ - dVar42 * 32500000.0 * stack0xfffffffffffffcb0;
      local_3c8._8_4_ = SUB84(dVar42,0);
      local_3c8._0_8_ = dVar44;
      local_3c8._12_4_ = (int)((ulong)dVar42 >> 0x20);
      uVar24 = local_398._12_4_;
      local_398._8_4_ = local_398._8_4_;
      local_398._0_8_ = local_398._0_8_ + dVar44;
      local_398._12_4_ = uVar24;
      dVar42 = exp((double)local_148._0_8_);
      local_4a8._0_8_ = (double)local_4a8._0_8_ * 216.0;
      dVar42 = dVar42 * 28900000.0;
      local_4a8._8_4_ = SUB84(dVar42,0);
      local_4a8._12_4_ = (int)((ulong)dVar42 >> 0x20);
      dVar2 = dVar9 * dVar35;
      local_418._8_4_ = SUB84(dVar2,0);
      local_418._0_8_ = (double)local_498._0_8_ * dVar9;
      local_418._12_4_ = (int)((ulong)dVar2 >> 0x20);
      local_3d8._8_4_ = SUB84(dVar2 * dVar42,0);
      local_3d8._0_8_ = (double)local_498._0_8_ * dVar9 * (double)local_4a8._0_8_;
      local_3d8._12_4_ = (int)((ulong)(dVar2 * dVar42) >> 0x20);
      dVar42 = exp((double)local_138._0_8_);
      dVar40 = (double)local_3d8._0_8_ -
               dVar34 * (double)local_348._0_8_ * (double)local_178._0_8_ * (double)local_4a8._0_8_;
      dVar42 = (double)local_3d8._8_8_ -
               (double)local_388._8_8_ * (double)local_348._8_8_ * dVar42 * (double)local_4a8._8_8_;
      local_3d8._8_4_ = SUB84(dVar42,0);
      local_3d8._0_8_ = dVar40;
      local_3d8._12_4_ = (int)((ulong)dVar42 >> 0x20);
      local_138._8_4_ = local_268._8_4_;
      local_138._0_8_ = local_268._0_8_ * (double)local_438._0_8_;
      local_138._12_4_ = local_268._12_4_;
      dVar42 = exp((double)local_f8._0_8_);
      dVar33 = (double)local_3f8._0_8_ * 16600000.0;
      dVar42 = dVar42 * 420000000.0;
      local_3f8._8_4_ = SUB84(dVar42,0);
      local_3f8._0_8_ = dVar33;
      local_3f8._12_4_ = (int)((ulong)dVar42 >> 0x20);
      dVar2 = dVar34 * (double)local_378._0_8_;
      dVar35 = dVar35 * (double)local_378._8_8_;
      auVar1._8_4_ = SUB84(dVar35,0);
      auVar1._0_8_ = dVar2;
      auVar1._12_4_ = (int)((ulong)dVar35 >> 0x20);
      local_4a8._8_4_ = SUB84(dVar35 * dVar42,0);
      local_4a8._0_8_ = dVar2 * dVar33;
      local_4a8._12_4_ = (int)((ulong)(dVar35 * dVar42) >> 0x20);
      dVar42 = exp((double)local_298._0_8_);
      dVar33 = (double)local_388._0_8_ * (double)local_498._0_8_;
      dVar35 = dVar4 * (double)local_388._0_8_;
      local_388._8_4_ = SUB84(dVar35,0);
      local_388._0_8_ = dVar33;
      local_388._12_4_ = (int)((ulong)dVar35 >> 0x20);
      dVar31 = (double)local_4a8._0_8_ - (double)local_328._0_8_ * (double)local_3f8._0_8_ * dVar33;
      dVar11 = (double)local_4a8._8_8_ - dVar42 * (double)local_3f8._8_8_ * dVar35;
      uVar24 = (undefined4)((ulong)dVar11 >> 0x20);
      dVar42 = (double)local_3e8._0_8_ - local_3c8._0_8_;
      local_3e8._8_4_ = local_3c8._8_4_;
      local_3e8._0_8_ = local_3c8._8_8_;
      local_3e8._12_4_ = local_3c8._12_4_;
      local_f8._8_4_ = local_3d8._8_4_;
      local_f8._0_8_ = local_3d8._8_8_;
      local_f8._12_4_ = local_3d8._12_4_;
      local_4a8._8_4_ = SUB84(dVar11,0);
      local_4a8._0_8_ = dVar31;
      local_4a8._12_4_ = uVar24;
      dVar33 = (double)local_338._0_8_ + dVar31 + local_3c8._8_8_ + local_3d8._8_8_ + dVar11;
      local_148._8_4_ = SUB84(dVar33,0);
      local_148._0_8_ = (dVar42 - local_3d8._0_8_) + dVar31;
      local_148._12_4_ = (int)((ulong)dVar33 >> 0x20);
      local_3f8._8_4_ = SUB84(dVar11,0);
      local_3f8._0_8_ = dVar11;
      local_3f8._12_4_ = uVar24;
      dVar42 = exp((double)local_d8._0_8_);
      local_328._8_4_ = extraout_XMM0_Dc_15;
      local_328._0_8_ = dVar42;
      local_328._12_4_ = extraout_XMM0_Dd_15;
      dVar42 = exp((double)local_298._0_8_);
      local_158._8_4_ = extraout_XMM0_Dc_16;
      local_158._0_8_ = dVar42;
      local_158._12_4_ = extraout_XMM0_Dd_16;
      dVar42 = exp((double)local_58._0_8_);
      local_298._0_8_ = dVar42;
      dVar42 = exp((double)local_3a8._0_8_);
      local_d8._0_8_ = dVar42;
      dVar42 = exp((double)local_c8._0_8_);
      dVar33 = (double)local_328._0_8_ * 130000.0;
      local_c8._8_4_ = SUB84(dVar33,0);
      local_c8._0_8_ = dVar42 * 48200000.0;
      local_c8._12_4_ = (int)((ulong)dVar33 >> 0x20);
      dStack_500 = auVar1._8_8_;
      local_3a8._8_4_ = SUB84(dStack_500 * dVar33,0);
      local_3a8._0_8_ = dVar34 * dVar4 * dVar42 * 48200000.0;
      local_3a8._12_4_ = (int)((ulong)(dStack_500 * dVar33) >> 0x20);
      dVar42 = exp(local_48);
      dVar36 = (double)local_3a8._0_8_ -
               (double)local_498._0_8_ * (double)local_378._0_8_ * dVar42 * (double)local_c8._0_8_;
      dVar8 = (double)local_3a8._8_8_ -
              (double)local_388._8_8_ * (double)local_158._0_8_ * (double)local_c8._8_8_;
      uVar24 = (undefined4)((ulong)dVar8 >> 0x20);
      dVar33 = dVar34 * dVar4 * (double)local_298._0_8_ * 24100000.0 -
               (double)local_268._0_8_ * dVar9 *
               (double)local_298._0_8_ * 24100000.0 * (double)local_d8._0_8_;
      local_488._8_4_ = SUB84((double)local_148._8_8_ + dVar8,0);
      local_488._0_8_ = (double)local_148._0_8_ + dVar36;
      local_488._12_4_ = (int)((ulong)((double)local_148._8_8_ + dVar8) >> 0x20);
      local_3a8._8_4_ = SUB84(dVar8,0);
      local_3a8._0_8_ = dVar36;
      local_3a8._12_4_ = uVar24;
      local_498._8_4_ = SUB84(dVar8,0);
      local_498._0_8_ = dVar8;
      local_498._12_4_ = uVar24;
      dVar42 = exp(local_b8 + local_b8 + (double)local_58._0_8_);
      local_388._0_8_ = dVar42 * 9.55;
      uVar24 = local_438._12_4_;
      local_438._8_4_ = local_438._8_4_;
      local_438._0_8_ = local_438._0_8_ * dVar4 * dVar42 * 9.55;
      local_438._12_4_ = uVar24;
      dVar42 = exp(-((((double)local_288._0_8_ - (double)local_408._0_8_) - (double)local_318._0_8_)
                    + (double)local_a8._0_8_));
      dVar13 = (double)local_438._0_8_ - (double)local_418._8_8_ * dVar42 * (double)local_388._0_8_;
      dVar42 = dVar2 * (double)local_168._0_8_ * 70790000.0 -
               (double)local_e8._0_8_ *
               (double)local_128._0_8_ * (double)local_168._0_8_ * 70790000.0;
      dVar2 = (double)local_138._0_8_ * (double)local_118._0_8_ * 2.97 -
              (double)local_e8._0_8_ * (double)local_108._0_8_ * (double)local_118._0_8_ * 2.97;
      dVar34 = ((dVar3 + dVar39 + dVar40) - dVar2) + (double)local_f8._0_8_;
      dVar12 = (dVar42 + dVar42 +
                dVar2 + dVar2 +
                ((((dVar32 + dVar32 + 0.0 + dVar12) - dVar39) + dVar10 + dVar44) - dVar40) +
               (double)local_3e8._0_8_) - (double)local_f8._0_8_;
      dVar35 = (((((((dVar37 + 0.0) - dVar31) - dVar42) - (double)local_3e8._0_8_) -
                 (double)local_f8._0_8_) - ((double)local_3f8._0_8_ + (double)local_3f8._0_8_)) -
               ((double)local_498._0_8_ + (double)local_498._0_8_)) + (double)local_3a8._0_8_;
      dVar2 = (((((double)local_3b8._0_8_ + (double)local_198._0_8_) - (double)local_3c8._0_8_) -
               dVar2) - (double)local_3c8._8_8_) - dVar13;
      auStack_470._8_4_ = SUB84(dVar2,0);
      auStack_470._0_8_ =
           (((((double)local_3d8._0_8_ + (double)local_398._0_8_) - (double)local_4a8._0_8_) -
            dVar42) - dVar33) - (double)local_3a8._0_8_;
      auStack_470._12_4_ = (int)((ulong)dVar2 >> 0x20);
      dVar42 = -((((double)local_408._0_8_ - (double)local_278._0_8_) - (double)local_318._0_8_) +
                (double)local_a8._0_8_);
      uVar14 = local_408._12_4_;
      local_408._8_4_ = local_408._8_4_;
      local_408._0_8_ = dVar42;
      local_408._12_4_ = uVar14 ^ 0x80000000;
      dVar42 = exp(dVar42);
      uVar24 = local_378._12_4_;
      dVar2 = local_378._0_8_ * (double)local_268._0_8_;
      local_378._8_4_ = local_378._8_4_;
      local_378._0_8_ = dVar2;
      local_378._12_4_ = uVar24;
      dVar44 = dVar4 * dVar9 * 1000000.0 - dVar42 * 1000000.0 * dVar2;
      dVar42 = exp(local_98 * -4809.24167509571);
      dVar2 = exp((double)local_408._0_8_);
      dVar9 = dVar4 * dVar9 * dVar42 * 580000000.0 -
              dVar2 * dVar42 * 580000000.0 * (double)local_378._0_8_;
      local_478 = dVar34 + dVar33 + dVar44 + dVar9;
      dStack_460 = ((dVar12 + dVar33 + dVar13) - dVar44) - dVar9;
      local_458 = dVar35 + dVar13 + dVar44 + dVar9;
      dStack_450 = (((((dVar43 + dVar11 + dVar8) - dVar33) - dVar36) - dVar13) - dVar44) - dVar9;
      lVar17 = 0;
      do {
        *(double *)(local_2e0 + lVar17 * 8 + -8) = *(double *)(local_2e0 + lVar17 * 8 + -8) * 1e-06;
        *(double *)(local_488 + lVar17 * 8) = *(double *)(local_488 + lVar17 * 8) * 1e-06;
        lVar17 = lVar17 + 1;
      } while (lVar17 != 9);
      local_4f8._8_8_ = 0x403fff7ced916873;
      local_4f8._0_8_ = 0x400020c49ba5e354;
      local_4e8 = 18.015;
      dStack_4e0 = 1.008;
      uStack_4d0 = 17.007;
      local_4d8 = (undefined1  [8])0x402fff7ced916873;
      local_4c8 = 33.006;
      dStack_4c0 = 34.014;
      local_4b8 = (undefined1 *)0x403c0395810624dd;
      lVar17 = 0;
      do {
        *(double *)(local_488 + lVar17 * 8) =
             *(double *)(local_4f8 + lVar17 * 8) * *(double *)(local_488 + lVar17 * 8);
        lVar17 = lVar17 + 1;
      } while (lVar17 != 9);
      dVar9 = *(double *)(local_2f0 + lVar21 * 8);
      lVar17 = 0;
      do {
        dVar43 = *(double *)(local_488 + lVar17 * 8) + *(double *)(lVar22 + lVar17 * 8);
        prVar16[lVar17] = dVar43;
        dVar9 = dVar9 - dVar43 * *(double *)(local_258 + lVar17 * 8);
        lVar17 = lVar17 + 1;
      } while (lVar17 != 9);
      local_300[lVar21 * 10 + 9] = (local_60 / local_420) * dVar9;
      lVar21 = lVar21 + 1;
      prVar18 = prVar18 + 10;
      prVar16 = prVar16 + 10;
      lVar22 = lVar22 + 0x48;
    } while (lVar21 != local_78);
  }
  amrex::Gpu::Device::streamSynchronize();
  return 0;
}

Assistant:

int
ReactorCvode::cF_RHS(
  realtype t, N_Vector y_in, N_Vector ydot_in, void* user_data)
{
  BL_PROFILE("Pele::ReactorCvode::cF_RHS()");
#ifdef AMREX_USE_GPU
  amrex::Real* yvec_d = N_VGetDeviceArrayPointer(y_in);
  amrex::Real* ydot_d = N_VGetDeviceArrayPointer(ydot_in);
#else
  amrex::Real* yvec_d = N_VGetArrayPointer(y_in);
  amrex::Real* ydot_d = N_VGetArrayPointer(ydot_in);
#endif

  auto* udata = static_cast<CVODEUserData*>(user_data);
  udata->dt_save = t;

  const auto ncells = udata->ncells;
  const auto dt_save = udata->dt_save;
  const auto reactor_type = udata->reactor_type;
  auto* rhoe_init = udata->rhoe_init;
  auto* rhoesrc_ext = udata->rhoesrc_ext;
  auto* rYsrc_ext = udata->rYsrc_ext;
  amrex::ParallelFor(ncells, [=] AMREX_GPU_DEVICE(int icell) noexcept {
    utils::fKernelSpec<Ordering>(
      icell, ncells, dt_save, reactor_type, yvec_d, ydot_d, rhoe_init,
      rhoesrc_ext, rYsrc_ext);
  });
  amrex::Gpu::Device::streamSynchronize();
  return 0;
}